

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

size_t __thiscall Memory::Recycler::BackgroundFindRoots(Recycler *this)

{
  size_t *psVar1;
  size_t sVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  GuestArenaAllocator *pGVar7;
  size_t sVar8;
  undefined1 local_50 [8];
  EditingIterator guestArenaIter;
  CollectionState local_34;
  
  sVar2 = (this->collectionStats).markData.markCount;
  if ((this->collectionState).value != CollectionStateConcurrentFindRoots) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f6,"(this->IsConcurrentFindRootState())",
                       "this->IsConcurrentFindRootState()");
    if (!bVar5) goto LAB_0071f150;
    *puVar6 = 0;
  }
  if (this->hasPendingConcurrentFindRoot == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f7,"(this->hasPendingConcurrentFindRoot)",
                       "this->hasPendingConcurrentFindRoot");
    if (!bVar5) goto LAB_0071f150;
    *puVar6 = 0;
  }
  if ((this->inPartialCollectMode == false) && (bVar5 = DoQueueTrackedObject(this), !bVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f9,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                       "this->inPartialCollectMode || this->DoQueueTrackedObject()");
    if (!bVar5) {
LAB_0071f150:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  guestArenaIter.super_Iterator.current = (NodeBase *)ScanPinnedObjects<true>(this);
  local_50 = (undefined1  [8])&this->guestArenaList;
  guestArenaIter.super_Iterator.list =
       (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_50;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_0071f01a:
  if (guestArenaIter.super_Iterator.list ==
      (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar5) goto LAB_0071f150;
    *puVar6 = 0;
  }
  guestArenaIter.super_Iterator.list =
       ((guestArenaIter.super_Iterator.list)->
       super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
  if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_50) {
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    ScanImplicitRoots(this);
    this->hasPendingConcurrentFindRoot = false;
    local_34 = CollectionStateConcurrentMark;
    pOVar3 = (this->collectionState).observer;
    if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
       ((this->collectionState).value != CollectionStateConcurrentMark)) {
      (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_34,&this->collectionState);
    }
    (this->collectionState).value = local_34;
    psVar1 = &(this->collectionStats).rootCount;
    *psVar1 = *psVar1 + ((this->collectionStats).markData.markCount - sVar2);
    return (size_t)guestArenaIter.super_Iterator.current;
  }
  pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)local_50);
  if (pGVar7->pendingDelete == true) {
    if (this->hasPendingDeleteGuestArena == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1616,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar5) goto LAB_0071f150;
      *puVar6 = 0;
    }
  }
  else {
    sVar8 = ScanArena(this,&(pGVar7->super_ArenaAllocator).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            .super_ArenaData,true);
    guestArenaIter.super_Iterator.current =
         (NodeBase *)((long)&(guestArenaIter.super_Iterator.current)->next + sVar8);
  }
  goto LAB_0071f01a;
}

Assistant:

size_t
Recycler::BackgroundFindRoots()
{
#ifdef RECYCLER_STATS
    size_t lastMarkCount = this->collectionStats.markData.markCount;
#endif

    size_t scanRootBytes = 0;
    Assert(this->IsConcurrentFindRootState());
    Assert(this->hasPendingConcurrentFindRoot);
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif

    // Only mark pinned object and guest arenas, which is where most of the roots are.
    // When we go back to the main thread to rescan, we will scan the rest of the root.

    // NOTE: purposefully not marking the transientPinnedObject there. as it is transient :)

    // background mark the pinned object. Since we are in concurrent find root state
    // the main thread won't delete any entries from the map, so concurrent read
    // to the map safe.

    GCETW(GC_BACKGROUNDSCANROOTS_START, (this));
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundFindRootsPhase);

    scanRootBytes += this->ScanPinnedObjects</*background = */true>();

    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::FindRootArenaPhase);
    // background mark the guest arenas. Since we are in concurrent find root state
    // the main thread won't delete any arena, so concurrent reads to them are ok.
    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
        if (allocator.pendingDelete)
        {
            // Skip guest arena that are already marked for delete
            Assert(this->hasPendingDeleteGuestArena);
            continue;
        }
        scanRootBytes += ScanArena(&allocator, true);
    }
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::FindRootArenaPhase);

    this->ScanImplicitRoots();

    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundFindRootsPhase);
    this->hasPendingConcurrentFindRoot = false;
    this->SetCollectionState(CollectionStateConcurrentMark);

    GCETW(GC_BACKGROUNDSCANROOTS_STOP, (this));
    RECYCLER_STATS_ADD(this, rootCount, this->collectionStats.markData.markCount - lastMarkCount);

    return scanRootBytes;
}